

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid.cpp
# Opt level: O1

int __thiscall ncnn::HardSigmoid::load_param(HardSigmoid *this,ParamDict *pd)

{
  float fVar1;
  float fVar2;
  
  fVar1 = ParamDict::get(pd,0,0.2);
  this->alpha = fVar1;
  fVar1 = ParamDict::get(pd,1,0.5);
  this->beta = fVar1;
  fVar2 = 1.0 / this->alpha;
  fVar1 = -fVar1 * fVar2;
  this->lower = fVar1;
  this->upper = fVar1 + fVar2;
  return 0;
}

Assistant:

int HardSigmoid::load_param(const ParamDict& pd)
{
    // tensorflow uses alpha,beta = 0.2, 0.5
    // pytorch uses alpha,beta = 1/6, 0.5
    alpha = pd.get(0, 0.2f);
    beta = pd.get(1, 0.5f);
    lower = -beta / alpha;
    upper = (1.f / alpha) + lower;

    return 0;
}